

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_iostream.h
# Opt level: O3

type __thiscall
_ST_PRIVATE::ostream_format_writer<wchar_t,_std::char_traits<wchar_t>_>::write_data<wchar_t>
          (ostream_format_writer<wchar_t,_std::char_traits<wchar_t>_> *this,char *data,size_t size)

{
  wchar_buffer wide;
  type local_50;
  
  ST::utf8_to_wchar<wchar_t>(&local_50,data,size,check_validity);
  std::wostream::write((wchar_t *)this->m_stream,(long)local_50.m_chars);
  if ((0xb < local_50.m_size) && (local_50.m_chars != (wchar_t *)0x0)) {
    operator_delete__(local_50.m_chars);
  }
  return;
}

Assistant:

typename std::enable_if<std::is_same<write_char_T, wchar_t>::value, void>::type
        write_data(const char *data, size_t size)
        {
            ST::wchar_buffer wide = ST::utf8_to_wchar(data, size);
            m_stream.write(wide.data(), wide.size());
        }